

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_03;
  int *piVar1;
  long lVar2;
  Tables *pTVar3;
  string *psVar4;
  uint uVar5;
  MessageOptions *pMVar6;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar7;
  ExtensionRangeOptions *pEVar8;
  long *plVar9;
  long *plVar10;
  Type *pTVar11;
  pointer pcVar12;
  OneofOptions *pOVar13;
  int iVar14;
  size_type *psVar15;
  ulong uVar16;
  DescriptorBuilder *pDVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  string local_118;
  RepeatedPtrFieldBase *local_f8;
  string local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  SubstituteArg local_80;
  Descriptor *local_50;
  DescriptorBuilder *local_48;
  Type *local_40;
  DescriptorProto *local_38;
  
  local_48 = this;
  local_38 = proto;
  if (*(long *)(message + 0x20) == 0) {
    pMVar6 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar6;
  }
  if (0 < *(int *)(message + 0x74)) {
    this_00 = &local_38->nested_type_;
    lVar21 = 0;
    lVar19 = 0;
    do {
      lVar18 = *(long *)(message + 0x38);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar19);
      CrossLinkMessage(local_48,(Descriptor *)(lVar18 + lVar21),proto_00);
      lVar19 = lVar19 + 1;
      lVar21 = lVar21 + 0x90;
    } while (lVar19 < *(int *)(message + 0x74));
  }
  if (0 < *(int *)(message + 0x78)) {
    this_01 = &local_38->enum_type_;
    lVar21 = 0;
    lVar19 = 0;
    do {
      lVar18 = *(long *)(message + 0x40);
      pDVar17 = (DescriptorBuilder *)this_01;
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,(int)lVar19);
      CrossLinkEnum(pDVar17,(EnumDescriptor *)(lVar18 + lVar21),proto_01);
      lVar19 = lVar19 + 1;
      lVar21 = lVar21 + 0x50;
    } while (lVar19 < *(int *)(message + 0x78));
  }
  pDVar17 = local_48;
  if (0 < *(int *)(message + 0x68)) {
    local_40 = (Type *)&local_38->field_;
    lVar21 = 0;
    lVar19 = 0;
    do {
      lVar18 = *(long *)(message + 0x28);
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         ((RepeatedPtrFieldBase *)local_40,(int)lVar19);
      CrossLinkField(pDVar17,(FieldDescriptor *)(lVar18 + lVar21),pTVar7);
      lVar19 = lVar19 + 1;
      lVar21 = lVar21 + 0x98;
    } while (lVar19 < *(int *)(message + 0x68));
  }
  if (0 < *(int *)(message + 0x80)) {
    local_40 = (Type *)&local_38->extension_;
    lVar21 = 0;
    lVar19 = 0;
    do {
      lVar18 = *(long *)(message + 0x50);
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         ((RepeatedPtrFieldBase *)local_40,(int)lVar19);
      CrossLinkField(pDVar17,(FieldDescriptor *)(lVar18 + lVar21),pTVar7);
      lVar19 = lVar19 + 1;
      lVar21 = lVar21 + 0x98;
    } while (lVar19 < *(int *)(message + 0x80));
  }
  if (0 < *(int *)(message + 0x7c)) {
    this_02 = &local_38->extension_range_;
    lVar21 = 8;
    lVar19 = 0;
    do {
      lVar18 = *(long *)(message + 0x48);
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                (&this_02->super_RepeatedPtrFieldBase,(int)lVar19);
      if (*(long *)(lVar18 + lVar21) == 0) {
        pEVar8 = ExtensionRangeOptions::default_instance();
        *(ExtensionRangeOptions **)(lVar18 + lVar21) = pEVar8;
      }
      lVar19 = lVar19 + 1;
      lVar21 = lVar21 + 0x10;
    } while (lVar19 < *(int *)(message + 0x7c));
  }
  uVar5 = *(uint *)(message + 0x68);
  if (0 < (int)uVar5) {
    local_f8 = &(local_38->field_).super_RepeatedPtrFieldBase;
    lVar19 = -0x98;
    lVar21 = 0;
    do {
      plVar10 = *(long **)(*(long *)(message + 0x28) + 0xf0 + lVar19);
      if (plVar10 != (long *)0x0) {
        if ((0 < (int)plVar10[3]) &&
           (*(long **)(*(long *)(message + 0x28) + 0x58 + lVar19) != plVar10)) {
          local_d0[0] = local_c0;
          lVar18 = **(long **)(message + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,lVar18,(*(long **)(message + 8))[1] + lVar18);
          std::__cxx11::string::append((char *)local_d0);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_d0,
                                      **(ulong **)(*(long *)(message + 0x28) + lVar19));
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar15 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_f0.field_2._M_allocated_capacity = *psVar15;
            local_f0.field_2._8_8_ = plVar9[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar15;
            local_f0._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_f0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          local_40 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                               (local_f8,(int)lVar21 + -1);
          local_b0._M_dataplus._M_p = (pointer)**(undefined8 **)(*(long *)(message + 0x28) + lVar19)
          ;
          local_b0._M_string_length =
               CONCAT44(local_b0._M_string_length._4_4_,
                        *(undefined4 *)(*(undefined8 **)(*(long *)(message + 0x28) + lVar19) + 1));
          local_80.text_ = *(char **)*plVar10;
          local_80.size_ = *(int *)((undefined8 *)*plVar10 + 1);
          local_268.text_ = (char *)0x0;
          local_268.size_ = -1;
          local_238.text_ = (char *)0x0;
          local_238.size_ = -1;
          local_208.text_ = (char *)0x0;
          local_208.size_ = -1;
          local_1d8.text_ = (char *)0x0;
          local_1d8.size_ = -1;
          local_1a8.text_ = (char *)0x0;
          local_1a8.size_ = -1;
          local_178.text_ = (char *)0x0;
          local_178.size_ = -1;
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          strings::Substitute_abi_cxx11_
                    (&local_118,
                     (strings *)
                     "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
                     ,(char *)&local_b0,&local_80,(SubstituteArg *)&stack0xfffffffffffffd68,
                     &local_268,&local_238,&local_208,&local_1d8,&local_1a8,&local_178,&local_148,
                     (SubstituteArg *)0x0);
          AddError(local_48,&local_f0,&local_40->super_Message,TYPE,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0]);
          }
          uVar5 = *(uint *)(message + 0x68);
        }
        piVar1 = (int *)(*(long *)(message + 0x30) + 0x18 +
                        (long)((int)((ulong)((long)plVar10 - *(long *)(plVar10[2] + 0x30)) >> 4) *
                              -0x55555555) * 0x30);
        *piVar1 = *piVar1 + 1;
      }
      lVar21 = lVar21 + 1;
      lVar19 = lVar19 + 0x98;
    } while (lVar21 < (int)uVar5);
  }
  uVar16 = (ulong)*(uint *)(message + 0x6c);
  if (0 < (int)*(uint *)(message + 0x6c)) {
    local_40 = (Type *)&local_38->oneof_decl_;
    lVar21 = 0x28;
    lVar19 = 0;
    pDVar17 = local_48;
    local_50 = message;
    do {
      lVar18 = *(long *)(message + 0x30);
      uVar5 = *(uint *)(lVar18 + -0x10 + lVar21);
      if (uVar5 == 0) {
        local_80.text_ = local_80.scratch_ + 4;
        lVar2 = **(long **)(message + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,lVar2,(*(long **)(message + 8))[1] + lVar2);
        std::__cxx11::string::append((char *)&local_80);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_80,**(ulong **)(lVar18 + -0x28 + lVar21));
        message = local_50;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        psVar15 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_b0.field_2._M_allocated_capacity = *psVar15;
          local_b0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar15;
          local_b0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_b0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pTVar11 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_40,(int)lVar19);
        AddError(pDVar17,&local_b0,&pTVar11->super_Message,NAME,
                 "Oneof must have at least one field.");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (local_80.text_ != local_80.scratch_ + 4) {
          operator_delete(local_80.text_);
        }
        uVar5 = *(uint *)(lVar18 + -0x10 + lVar21);
      }
      pTVar3 = pDVar17->tables_;
      local_b0._M_dataplus._M_p._0_4_ = uVar5 << 3;
      if ((uVar5 & 0x1fffffff) == 0) {
        pcVar12 = (pointer)0x0;
      }
      else {
        std::
        vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
        ::emplace_back<int&>
                  ((vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
                    *)&pTVar3->allocations_,(int *)&local_b0);
        pcVar12 = (pTVar3->allocations_).
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_start;
      }
      pDVar17 = local_48;
      *(pointer *)(lVar18 + -8 + lVar21) = pcVar12;
      *(undefined4 *)(lVar18 + -0x10 + lVar21) = 0;
      if (*(long *)(lVar18 + lVar21) == 0) {
        pOVar13 = OneofOptions::default_instance();
        *(OneofOptions **)(lVar18 + lVar21) = pOVar13;
      }
      lVar19 = lVar19 + 1;
      uVar16 = (ulong)*(int *)(message + 0x6c);
      lVar21 = lVar21 + 0x30;
    } while (lVar19 < (long)uVar16);
    uVar5 = *(uint *)(message + 0x68);
  }
  if (0 < (int)uVar5) {
    lVar19 = 0;
    do {
      lVar21 = *(long *)(message + 0x28);
      lVar18 = *(long *)(lVar21 + 0x58 + lVar19);
      if (lVar18 != 0) {
        lVar2 = *(long *)(message + 0x30);
        lVar18 = (long)((int)((ulong)(lVar18 - *(long *)(*(long *)(lVar18 + 0x10) + 0x30)) >> 4) *
                       -0x55555555) * 0x30;
        iVar14 = *(int *)(lVar2 + 0x18 + lVar18);
        *(int *)(lVar21 + 0x48 + lVar19) = iVar14;
        *(int *)(lVar2 + 0x18 + lVar18) = iVar14 + 1;
        *(long *)(*(long *)(lVar2 + 0x20 + lVar18) + (long)iVar14 * 8) = lVar21 + lVar19;
      }
      lVar19 = lVar19 + 0x98;
    } while ((ulong)uVar5 * 0x98 - lVar19 != 0);
    if (0 < (int)uVar5) {
      this_03 = &local_38->field_;
      lVar21 = 0x58;
      lVar19 = 0;
      do {
        if ((*(char *)(*(long *)(message + 0x28) + -0x17 + lVar21) == '\x01') &&
           (((lVar18 = *(long *)(*(long *)(message + 0x28) + lVar21), lVar18 == 0 ||
             (*(int *)(lVar18 + 0x18) != 1)) ||
            (*(char *)(**(long **)(lVar18 + 0x20) + 0x41) == '\0')))) {
          psVar4 = *(string **)(message + 8);
          pTVar7 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                             (&this_03->super_RepeatedPtrFieldBase,(int)lVar19);
          AddError(local_48,psVar4,&pTVar7->super_Message,OTHER,
                   "Fields with proto3_optional set must be a member of a one-field oneof");
          uVar5 = *(uint *)(message + 0x68);
        }
        lVar19 = lVar19 + 1;
        lVar21 = lVar21 + 0x98;
      } while (lVar19 < (int)uVar5);
      uVar16 = (ulong)*(uint *)(message + 0x6c);
    }
  }
  iVar14 = (int)uVar16;
  if (0 < (int)uVar16) {
    local_38 = (DescriptorProto *)&local_38->oneof_decl_;
    iVar20 = -1;
    lVar19 = 0x20;
    lVar21 = 0;
    do {
      if ((*(int *)(*(long *)(message + 0x30) + -8 + lVar19) == 1) &&
         (*(char *)(**(long **)(*(long *)(message + 0x30) + lVar19) + 0x41) == '\x01')) {
        if (iVar20 == -1) {
          iVar20 = (int)lVar21;
        }
      }
      else if (iVar20 == -1) {
        iVar20 = -1;
      }
      else {
        psVar4 = *(string **)(message + 8);
        pTVar11 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_38,(int)lVar21);
        AddError(local_48,psVar4,&pTVar11->super_Message,OTHER,
                 "Synthetic oneofs must be after all other oneofs");
        uVar16 = (ulong)*(uint *)(message + 0x6c);
      }
      lVar21 = lVar21 + 1;
      lVar19 = lVar19 + 0x30;
    } while (lVar21 < (int)uVar16);
    iVar14 = (int)uVar16;
    if (iVar20 != -1) {
      iVar14 = iVar20;
    }
  }
  *(int *)(message + 0x70) = iVar14;
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  if (message->options_ == nullptr) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < message->extension_range_count(); i++) {
    CrossLinkExtensionRange(&message->extension_ranges_[i],
                            proto.extension_range(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(message->full_name() + "." + message->field(i - 1)->name(),
                 proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute(
                     "Fields in the same oneof must be defined consecutively. "
                     "\"$0\" cannot be defined before the completion of the "
                     "\"$1\" oneof definition.",
                     message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ = tables_->AllocateArray<const FieldDescriptor*>(
        oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == nullptr) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->proto3_optional_) {
      if (!field->containing_oneof() ||
          !field->containing_oneof()->is_synthetic()) {
        AddError(message->full_name(), proto.field(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Fields with proto3_optional set must be "
                 "a member of a one-field oneof");
      }
    }
  }

  // Synthetic oneofs must be last.
  int first_synthetic = -1;
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    if (oneof->is_synthetic()) {
      if (first_synthetic == -1) {
        first_synthetic = i;
      }
    } else {
      if (first_synthetic != -1) {
        AddError(message->full_name(), proto.oneof_decl(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
    }
  }

  if (first_synthetic == -1) {
    message->real_oneof_decl_count_ = message->oneof_decl_count_;
  } else {
    message->real_oneof_decl_count_ = first_synthetic;
  }
}